

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O3

optional<unsigned_int> __thiscall absl::lts_20250127::Cord::ExpectedChecksum(Cord *this)

{
  CordRep *pCVar1;
  crc32c_t cVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) ||
     (pCVar1 = (this->contents_).data_.rep_.field_0.as_tree.rep, pCVar1->tag != '\x02')) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    cVar2 = crc_internal::CrcCordState::Checksum((CrcCordState *)&pCVar1[1].refcount);
    uVar3 = (ulong)cVar2.crc_;
    uVar4 = 0x100000000;
  }
  return (optional<unsigned_int>)(uVar3 | uVar4);
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }